

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O2

void socks_proxy_cf_close(Curl_cfilter *cf,Curl_easy *data)

{
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  if (cf->ctx != (void *)0x0) {
    (*Curl_cfree)(cf->ctx);
    cf->ctx = (void *)0x0;
  }
  (*(code *)cf->next->cft->do_close)(cf->next,data);
  return;
}

Assistant:

static void socks_proxy_cf_close(struct Curl_cfilter *cf,
                                 struct Curl_easy *data)
{

  DEBUGASSERT(cf->next);
  cf->connected = FALSE;
  socks_proxy_cf_free(cf);
  cf->next->cft->do_close(cf->next, data);
}